

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O1

ostream * toml::operator<<(ostream *os,local_date *date)

{
  ostream oVar1;
  ostream *poVar2;
  char local_1a [2];
  
  poVar2 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar1 = (ostream)std::ios::widen((char)poVar2);
    poVar2[0xe0] = oVar1;
    poVar2[0xe1] = (ostream)0x1;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
  poVar2 = (ostream *)std::ostream::operator<<(os,(int)date->year);
  local_1a[0] = '-';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a,1);
  poVar2 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar1 = (ostream)std::ios::widen((char)poVar2);
    poVar2[0xe0] = oVar1;
    poVar2[0xe1] = (ostream)0x1;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  poVar2 = (ostream *)std::ostream::operator<<(os,date->month + 1);
  local_1a[1] = 0x2d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a + 1,1);
  poVar2 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar1 = (ostream)std::ios::widen((char)poVar2);
    poVar2[0xe0] = oVar1;
    poVar2[0xe1] = (ostream)0x1;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  std::ostream::operator<<(os,(uint)date->day);
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const local_date& date)
{
    os << std::setfill('0') << std::setw(4) << static_cast<int>(date.year )     << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.month) + 1 << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.day  )    ;
    return os;
}